

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O3

void __thiscall
ON_RandomNumberGenerator::TwoGaussians(ON_RandomNumberGenerator *this,double *u,double *v)

{
  ON__UINT32 OVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (v != (double *)0x0 && u != (double *)0x0) {
    OVar1 = on_random_number(&this->m_rand_context);
    dVar2 = (double)OVar1 / 4294967295.0;
    OVar1 = on_random_number(&this->m_rand_context);
    dVar2 = log((double)(-(ulong)(dVar2 < 1e-20) & 0x3fe0000000000000 |
                        ~-(ulong)(dVar2 < 1e-20) &
                        (-(ulong)(1.0 < dVar2) & 0x3fe0000000000000 |
                        ~-(ulong)(1.0 < dVar2) & (ulong)dVar2)));
    dVar2 = dVar2 * -2.0;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar3 = ((double)OVar1 / 4294967295.0) * 6.283185307179586;
    dVar4 = cos(dVar3);
    *u = dVar4 * dVar2;
    dVar3 = sin(dVar3);
    *v = dVar3 * dVar2;
  }
  return;
}

Assistant:

void ON_RandomNumberGenerator::TwoGaussians(double* u, double* v)
{
  if (!u || !v) return;
  double t = RandomDouble();
  double s = RandomDouble();
  // if there is a problem with the random number generator, we don't want to crash the FPU in the logarithm
  if (t < 1e-20 || t > 1.0)  
    t = .5;
  double m = sqrt(-2.0 * log(t));
  *u = m * cos(ON_2PI * s);
  *v = m * sin(ON_2PI * s);
}